

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O0

void __thiscall RVO::KdTree::buildObstacleTree(KdTree *this)

{
  value_type pOVar1;
  size_type sVar2;
  reference ppOVar3;
  ObstacleTreeNode *pOVar4;
  ulong local_48;
  size_t i;
  allocator<RVO::Obstacle_*> local_29;
  undefined1 local_28 [8];
  vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> obstacles;
  KdTree *this_local;
  
  obstacles.super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  deleteObstacleTree(this,this->obstacleTree_);
  sVar2 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::size
                    (&this->sim_->obstacles_);
  std::allocator<RVO::Obstacle_*>::allocator(&local_29);
  std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::vector
            ((vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)local_28,sVar2,&local_29);
  std::allocator<RVO::Obstacle_*>::~allocator(&local_29);
  local_48 = 0;
  while( true ) {
    sVar2 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::size
                      (&this->sim_->obstacles_);
    if (sVar2 <= local_48) break;
    ppOVar3 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::operator[]
                        (&this->sim_->obstacles_,local_48);
    pOVar1 = *ppOVar3;
    ppOVar3 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::operator[]
                        ((vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)local_28,
                         local_48);
    *ppOVar3 = pOVar1;
    local_48 = local_48 + 1;
  }
  pOVar4 = buildObstacleTreeRecursive
                     (this,(vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)local_28);
  this->obstacleTree_ = pOVar4;
  std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::~vector
            ((vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)local_28);
  return;
}

Assistant:

void KdTree::buildObstacleTree()
	{
		deleteObstacleTree(obstacleTree_);

		std::vector<Obstacle *> obstacles(sim_->obstacles_.size());

		for (size_t i = 0; i < sim_->obstacles_.size(); ++i) {
			obstacles[i] = sim_->obstacles_[i];
		}

		obstacleTree_ = buildObstacleTreeRecursive(obstacles);
	}